

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

pair<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::iterator,_bool>
* __thiscall
stx::
btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
::insert_descend(pair<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::iterator,_bool>
                 *__return_storage_ptr__,
                btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                *this,node *n,key_type *key,data_type *value,key_type *splitkey,node **splitnode)

{
  unsigned_short *puVar1;
  node *pnVar2;
  ushort uVar3;
  long lVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  node *newchild;
  key_type newkey;
  node *local_50;
  undefined8 local_48;
  
  if (n->level == 0) {
    uVar3 = n->slotuse;
    uVar7 = (uint)uVar3;
    if (uVar3 == 0) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      do {
        if (*key <= *(double *)(n + uVar8 * 2 + 6)) goto LAB_001091b9;
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
      uVar8 = (ulong)uVar7;
    }
LAB_001091b9:
    iVar6 = (int)uVar8;
    if ((iVar6 < (int)uVar7) && (*key == *(double *)(n + (long)iVar6 * 2 + 6))) {
      (__return_storage_ptr__->first).currnode = (leaf_node *)n;
      (__return_storage_ptr__->first).currslot = (unsigned_short)uVar8;
      *(ulong *)&(__return_storage_ptr__->first).field_0xa = (ulong)(uint6)local_48;
      *(undefined8 *)((long)&(__return_storage_ptr__->first).temp_value.first + 2) = 0;
      (__return_storage_ptr__->first).temp_value.second = (BufferNode<double,_long> *)0x0;
      __return_storage_ptr__->second = false;
    }
    else {
      if (uVar7 == 0x10) {
        split_leaf_node(this,(leaf_node *)n,splitkey,splitnode);
        puVar1 = &n->slotuse;
        if ((int)(uint)*puVar1 <= iVar6) {
          n = *splitnode;
          iVar6 = iVar6 - (uint)*puVar1;
        }
      }
      lVar9 = (long)iVar6;
      lVar4 = (ulong)(((leaf_node *)n)->super_node).slotuse * 8;
      sVar5 = lVar4 + lVar9 * -8;
      if (sVar5 != 0) {
        memmove((void *)((long)n + (lVar4 - sVar5) + 0x20),((leaf_node *)n)->slotkey + lVar9,sVar5);
      }
      lVar4 = (ulong)(((leaf_node *)n)->super_node).slotuse * 8;
      sVar5 = lVar4 + lVar9 * -8;
      if (sVar5 != 0) {
        memmove((void *)((long)n + (lVar4 - sVar5) + 0xa0),((leaf_node *)n)->slotdata + lVar9,sVar5)
        ;
      }
      ((leaf_node *)n)->slotkey[lVar9] = *key;
      ((leaf_node *)n)->slotdata[lVar9] = *value;
      uVar3 = (((leaf_node *)n)->super_node).slotuse + 1;
      (((leaf_node *)n)->super_node).slotuse = uVar3;
      if (((splitnode != (node **)0x0) && ((leaf_node *)n != (leaf_node *)*splitnode)) &&
         (iVar6 == uVar3 - 1)) {
        *splitkey = *key;
      }
      (__return_storage_ptr__->first).currnode = (leaf_node *)n;
      (__return_storage_ptr__->first).currslot = (unsigned_short)iVar6;
      *(ulong *)&(__return_storage_ptr__->first).field_0xa = (ulong)(uint6)local_48;
      *(undefined8 *)((long)&(__return_storage_ptr__->first).temp_value.first + 2) = 0;
      (__return_storage_ptr__->first).temp_value.second = (BufferNode<double,_long> *)0x0;
      __return_storage_ptr__->second = true;
    }
  }
  else {
    uVar8 = 0;
    local_48._0_6_ = 0;
    local_48._6_2_ = 0;
    local_50 = (node *)0x0;
    uVar3 = n->slotuse;
    if (uVar3 != 0) {
      uVar8 = 0;
      do {
        if (*key <= *(double *)(n + uVar8 * 2 + 2)) goto LAB_00109039;
        uVar8 = uVar8 + 1;
      } while ((uint)uVar3 != uVar8);
      uVar8 = (ulong)(uint)uVar3;
    }
LAB_00109039:
    uVar7 = (uint)uVar8;
    insert_descend(__return_storage_ptr__,this,*(node **)(n + (long)(int)uVar7 * 2 + 0x22),key,value
                   ,(key_type *)&local_48,&local_50);
    if (local_50 != (node *)0x0) {
      if (n->slotuse == 0x10) {
        split_inner_node(this,(inner_node *)n,splitkey,splitnode,uVar7);
        uVar3 = n->slotuse;
        if ((uVar7 == uVar3 + 1) && (pnVar2 = *splitnode, uVar3 < pnVar2->slotuse)) {
          *(key_type *)(n + (ulong)uVar3 * 2 + 2) = *splitkey;
          *(undefined8 *)(n + (ulong)uVar3 * 2 + 0x24) = *(undefined8 *)(pnVar2 + 0x22);
          n->slotuse = (unsigned_short)(uVar3 + 1);
          *(node **)(pnVar2 + 0x22) = local_50;
          *splitkey = (key_type)CONCAT26(local_48._6_2_,(uint6)local_48);
          return __return_storage_ptr__;
        }
        if ((int)(uint)uVar3 < (int)uVar7) {
          uVar7 = uVar7 + ~(uint)uVar3;
          n = *splitnode;
        }
      }
      lVar9 = (long)(int)uVar7;
      lVar4 = (ulong)n->slotuse * 8;
      sVar5 = lVar4 + lVar9 * -8;
      if (sVar5 != 0) {
        memmove((void *)((long)n + (lVar4 - sVar5) + 0x10),n + lVar9 * 2 + 2,sVar5);
      }
      sVar5 = (long)n + (((ulong)n->slotuse * 8 + 0x90) - (long)(n + lVar9 * 2 + 0x22));
      if (sVar5 != 0) {
        memmove((void *)((long)n + ((ulong)n->slotuse * 8 - sVar5) + 0x98),n + lVar9 * 2 + 0x22,
                sVar5);
      }
      *(ulong *)(n + lVar9 * 2 + 2) = CONCAT26(local_48._6_2_,(uint6)local_48);
      *(node **)(n + lVar9 * 2 + 0x24) = local_50;
      n->slotuse = n->slotuse + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert_descend(node* n,
                                                 const key_type& key, const data_type& value,
                                                 key_type* splitkey, node** splitnode)
        {
            if (!n->isleafnode())
            {
                inner_node *inner = static_cast<inner_node*>(n);

                key_type newkey = key_type();
                node *newchild = NULL;

                int slot = find_lower(inner, key);

                BTREE_PRINT("btree::insert_descend into " << inner->childid[slot]);

                std::pair<iterator, bool> r = insert_descend(inner->childid[slot],
                                                             key, value, &newkey, &newchild);

                if (newchild)
                {
                    BTREE_PRINT("btree::insert_descend newchild with key " << newkey << " node " << newchild << " at slot " << slot);

                    if (inner->isfull())
                    {
                        split_inner_node(inner, splitkey, splitnode, slot);

                        BTREE_PRINT("btree::insert_descend done split_inner: putslot: " << slot << " putkey: " << newkey << " upkey: " << *splitkey);

#ifdef BTREE_DEBUG
                        if (debug)
                    {
                        print_node(std::cout, inner);
                        print_node(std::cout, *splitnode);
                    }
#endif

                        // check if insert slot is in the split sibling node
                        BTREE_PRINT("btree::insert_descend switch: " << slot << " > " << inner->slotuse+1);

                        if (slot == inner->slotuse+1 && inner->slotuse < (*splitnode)->slotuse)
                        {
                            // special case when the insert slot matches the split
                            // place between the two nodes, then the insert key
                            // becomes the split key.

                            BTREE_ASSERT(inner->slotuse + 1 < innerslotmax);

                            inner_node *splitinner = static_cast<inner_node*>(*splitnode);

                            // move the split key and it's datum into the left node
                            inner->slotkey[inner->slotuse] = *splitkey;
                            inner->childid[inner->slotuse+1] = splitinner->childid[0];
                            inner->slotuse++;

                            // set new split key and move corresponding datum into right node
                            splitinner->childid[0] = newchild;
                            *splitkey = newkey;

                            return r;
                        }
                        else if (slot >= inner->slotuse+1)
                        {
                            // in case the insert slot is in the newly create split
                            // node, we reuse the code below.

                            slot -= inner->slotuse+1;
                            inner = static_cast<inner_node*>(*splitnode);
                            BTREE_PRINT("btree::insert_descend switching to splitted node " << inner << " slot " << slot);
                        }
                    }

                    // move items and put pointer to child node into correct slot
                    BTREE_ASSERT(slot >= 0 && slot <= inner->slotuse);

                    std::copy_backward(inner->slotkey + slot, inner->slotkey + inner->slotuse,
                                       inner->slotkey + inner->slotuse+1);
                    std::copy_backward(inner->childid + slot, inner->childid + inner->slotuse+1,
                                       inner->childid + inner->slotuse+2);

                    inner->slotkey[slot] = newkey;
                    inner->childid[slot + 1] = newchild;
                    inner->slotuse++;
                }

                return r;
            }
            else // n->isleafnode() == true
            {
                leaf_node *leaf = static_cast<leaf_node*>(n);

                int slot = find_lower(leaf, key);

                if (!allow_duplicates && slot < leaf->slotuse && key_equal(key, leaf->slotkey[slot])) {
                    return std::pair<iterator, bool>(iterator(leaf, slot), false);
                }

                if (leaf->isfull())
                {
                    split_leaf_node(leaf, splitkey, splitnode);

                    // check if insert slot is in the split sibling node
                    if (slot >= leaf->slotuse)
                    {
                        slot -= leaf->slotuse;
                        leaf = static_cast<leaf_node*>(*splitnode);
                    }
                }

                // move items and put data item into correct data slot
                BTREE_ASSERT(slot >= 0 && slot <= leaf->slotuse);

                std::copy_backward(leaf->slotkey + slot, leaf->slotkey + leaf->slotuse,
                                   leaf->slotkey + leaf->slotuse+1);
                data_copy_backward(leaf->slotdata + slot, leaf->slotdata + leaf->slotuse,
                                   leaf->slotdata + leaf->slotuse+1);

                leaf->slotkey[slot] = key;
                if (!used_as_set) leaf->slotdata[slot] = value;
                leaf->slotuse++;

                if (splitnode && leaf != *splitnode && slot == leaf->slotuse-1)
                {
                    // special case: the node was split, and the insert is at the
                    // last slot of the old node. then the splitkey must be
                    // updated.
                    *splitkey = key;
                }

                return std::pair<iterator, bool>(iterator(leaf, slot), true);
            }
        }